

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O1

ion_bpp_err_t flushAll(ion_bpp_handle_t handle)

{
  ion_bpp_err_t in_EAX;
  ion_bpp_buffer_t *buf;
  
  if ((*(int *)((long)handle + 0x44) != 0) &&
     (in_EAX = flush(handle,(ion_bpp_buffer_t *)((long)handle + 0x20)), in_EAX != bErrOk)) {
    return in_EAX;
  }
  buf = *(ion_bpp_buffer_t **)((long)handle + 0x48);
  while( true ) {
    if (buf == (ion_bpp_buffer_t *)((long)handle + 0x48)) {
      return in_EAX;
    }
    if ((buf->modified != boolean_false) && (in_EAX = flush(handle,buf), in_EAX != bErrOk)) break;
    buf = buf->next;
  }
  return in_EAX;
}

Assistant:

static ion_bpp_err_t
flushAll(
	ion_bpp_handle_t handle
) {
	ion_bpp_h_node_t	*h = handle;
	ion_bpp_err_t		rc;			/* return code */
	ion_bpp_buffer_t	*buf;				/* buffer */

	if (h->root.modified) {
		if ((rc = flush(handle, &h->root)) != 0) {
			return rc;
		}
	}

	buf = h->bufList.next;

	while (buf != &h->bufList) {
		if (buf->modified) {
			if ((rc = flush(handle, buf)) != 0) {
				return rc;
			}
		}

		buf = buf->next;
	}

	return bErrOk;
}